

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9PFan(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint local_30;
  int nNodes;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9PFan(): There is no AIG.\n");
        return 1;
      }
      Gia_ManPrintFanio(pAbc->pGia,local_30);
      return 0;
    }
    if (iVar1 != 0x4e) goto LAB_00248841;
    if (argc <= globalUtilOptind) break;
    local_30 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_30 < 0) {
LAB_00248841:
      Abc_Print(-2,"usage: &pfan [-N num] [-h]\n");
      Abc_Print(-2,"\t         prints fanin/fanout statistics\n");
      Abc_Print(-2,"\t-N num : the number of high-fanout nodes to explore [default = %d]\n",
                (ulong)local_30);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_00248841;
}

Assistant:

int Abc_CommandAbc9PFan( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    int nNodes = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodes < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PFan(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManPrintFanio( pAbc->pGia, nNodes );
    return 0;

usage:
    Abc_Print( -2, "usage: &pfan [-N num] [-h]\n" );
    Abc_Print( -2, "\t         prints fanin/fanout statistics\n" );
    Abc_Print( -2, "\t-N num : the number of high-fanout nodes to explore [default = %d]\n", nNodes );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}